

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_reference.c
# Opt level: O2

bool_t prf_instance_reference_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int16_t *piVar1;
  bool_t bVar2;
  
  if (node->opcode == prf_instance_reference_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    piVar1 = (int16_t *)node->data;
    bf_put_int16_be(bfile,*piVar1);
    bf_put_int16_be(bfile,piVar1[1]);
    bVar2 = 1;
    if (8 < node->length) {
      bf_write(bfile,node->data + 4,node->length - 8);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"instance reference save method on node of type %d.");
  }
  return bVar2;
}

Assistant:

static bool_t
prf_instance_reference_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile)
{
    node_data * data;
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_instance_reference_info.opcode ) {
        prf_error( 9, "instance reference save method on node of type %d.",
                   node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    data = (node_data *) node->data;
    assert( data != NULL );
    bf_put_int16_be( bfile, data->spare ); pos += 2;
    bf_put_int16_be( bfile, data->instance_definition_number ); pos += 2;

    if ( pos < node->length ) /* padding */
        pos += bf_write( bfile, node->data + pos - 4, node->length - pos );
    return TRUE;
}